

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O2

Serializer * __thiscall
jbcoin::STObject::getSerializer(Serializer *__return_storage_ptr__,STObject *this)

{
  Serializer::Serializer(__return_storage_ptr__,0x100);
  add(this,__return_storage_ptr__,true);
  return __return_storage_ptr__;
}

Assistant:

Serializer getSerializer () const
    {
        Serializer s;
        add (s, true);
        return s;
    }